

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

void __thiscall AutoFile::ignore(AutoFile *this,size_t nSize)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  FILE *__stream;
  size_t __n;
  long in_FS_OFFSET;
  uchar data [4096];
  
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_file == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    data._8_8_ = std::iostream_category();
    data[0] = '\x01';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::ignore: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    while (nSize != 0) {
      __n = 0x1000;
      if (nSize < 0x1000) {
        __n = nSize;
      }
      __stream = (FILE *)&DAT_00000001;
      sVar3 = fread(data,1,__n,(FILE *)this->m_file);
      if (sVar3 != __n) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        iVar2 = feof(this,__stream);
        pcVar5 = "AutoFile::ignore: fread failed";
        if ((char)iVar2 != '\0') {
          pcVar5 = "AutoFile::ignore: end of file";
        }
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)pcVar5);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_00b0d3dd;
      }
      nSize = nSize - __n;
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value + __n;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
LAB_00b0d3dd:
  __stack_chk_fail();
}

Assistant:

void AutoFile::ignore(size_t nSize)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::ignore: file handle is nullptr");
    unsigned char data[4096];
    while (nSize > 0) {
        size_t nNow = std::min<size_t>(nSize, sizeof(data));
        if (std::fread(data, 1, nNow, m_file) != nNow) {
            throw std::ios_base::failure(feof() ? "AutoFile::ignore: end of file" : "AutoFile::ignore: fread failed");
        }
        nSize -= nNow;
        if (m_position.has_value()) *m_position += nNow;
    }
}